

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool createRcc(Options *options)

{
  int *piVar1;
  FILE *__stream;
  Data *pDVar2;
  QStringBuilder<const_QString_&,_QLatin1String> *pQVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  char *pcVar7;
  QStringBuilder<const_QString_&,_QLatin1String> **ppQVar8;
  long in_FS_OFFSET;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QByteArrayView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QArrayData *local_1d8 [3];
  QString local_1c0;
  QString local_1a8;
  QString local_188;
  QArrayData *local_170 [3];
  QArrayData *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  QString local_138;
  QString local_118;
  QArrayData *local_f8;
  QStringBuilder<const_QString_&,_QLatin1String> **ppQStack_f0;
  undefined1 *local_e8;
  QString local_e0;
  QStringBuilder<const_QString_&,_QLatin1String> *local_c8;
  char *local_c0;
  long local_b8;
  QStringBuilder<const_QString_&,_QLatin1String> *local_a8;
  char16_t *local_a0;
  ulong local_98;
  QArrayData local_88;
  ulong local_78;
  QStringBuilder<const_QString_&,_QLatin1String> local_68;
  QString *local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppQStack_f0 = (QStringBuilder<const_QString_&,_QLatin1String> **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.b.m_size = (qsizetype)(options->outputDirectory).d.ptr;
  local_68.b.m_data = (char *)((options->outputDirectory).d.size | 0x8000000000000000);
  local_68.a._0_1_ = 1;
  local_88.alloc = 0;
  QVar9.m_size = (size_t)"%1/assets";
  QVar9.field_0.m_data = &local_f8;
  local_88._0_8_ = &local_68;
  QtPrivate::argToQString(QVar9,0x4000000000000009,(ArgBase **)0x1);
  local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
  local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
  local_68.b.m_size = (qsizetype)ppQStack_f0;
  local_a0 = (char16_t *)0x0;
  QVar10.m_size = (size_t)"%1/android_rcc_bundle";
  QVar10.field_0.m_data_utf8 = (char *)&local_88;
  local_a8 = &local_68;
  QtPrivate::argToQString(QVar10,0x4000000000000015,(ArgBase **)0x1);
  QDir::QDir((QDir *)&local_68,(QString *)&local_88);
  cVar5 = QDir::exists();
  QDir::~QDir((QDir *)&local_68);
  uVar4 = local_88._0_8_;
  if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
      (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
    LOCK();
    *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
    UNLOCK();
    if (*(int *)(QString **)uVar4 == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (cVar5 == '\0') {
    fwrite("Skipping createRCC\n",0x13,1,_stdout);
    bVar6 = true;
    goto LAB_00120c1e;
  }
  if (options->verbose == true) {
    fwrite("Create rcc bundle.\n",0x13,1,_stdout);
  }
  local_118.d.d = (Data *)0x0;
  local_118.d.ptr = (char16_t *)0x0;
  local_118.d.size = 0;
  if ((options->rccBinaryPath).d.size == 0) {
    local_68.a = &options->qtLibExecsDirectory;
    local_68.b.m_size = (qsizetype)&DAT_00000004;
    local_68.b.m_data = "/rcc";
    QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>(&local_138,&local_68);
    pDVar2 = local_118.d.d;
    local_118.d.size = local_138.d.size;
    local_118.d.ptr = local_138.d.ptr;
    local_118.d.d = local_138.d.d;
    local_138.d.size = 0;
    local_138.d.d = (Data *)0x0;
    local_138.d.ptr = (char16_t *)0x0;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QString::operator=(&local_118,(QString *)&options->rccBinaryPath);
  }
  cVar5 = QFile::exists((QString *)&local_118);
  if (cVar5 == '\0') {
    createRcc();
    bVar6 = false;
  }
  else {
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::currentPath();
    local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
    local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
    local_68.b.m_size = (qsizetype)ppQStack_f0;
    local_a0 = (char16_t *)0x0;
    QVar11.m_size = (size_t)"%1/android_rcc_bundle";
    QVar11.field_0.m_data_utf8 = (char *)&local_88;
    local_a8 = &local_68;
    QtPrivate::argToQString(QVar11,0x4000000000000015,(ArgBase **)0x1);
    cVar5 = QDir::setCurrent((QString *)&local_88);
    if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
        (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
      LOCK();
      *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
      UNLOCK();
      if (*(int *)(QString **)local_88._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    __stream = _stderr;
    if (cVar5 == '\0') {
      local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
      local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
      local_68.b.m_size = (qsizetype)ppQStack_f0;
      local_a0 = (char16_t *)0x0;
      QVar21.m_size = (size_t)"%1/android_rcc_bundle";
      QVar21.field_0.m_data = &local_88;
      local_a8 = &local_68;
      QtPrivate::argToQString(QVar21,0x4000000000000015,(ArgBase **)0x1);
      QString::toLocal8Bit_helper((QChar *)&local_68,local_88.alloc);
      ppQVar8 = (QStringBuilder<const_QString_&,_QLatin1String> **)local_68.b.m_size;
      if ((QStringBuilder<const_QString_&,_QLatin1String> **)local_68.b.m_size ==
          (QStringBuilder<const_QString_&,_QLatin1String> **)0x0) {
        ppQVar8 = (QStringBuilder<const_QString_&,_QLatin1String> **)&QByteArray::_empty;
      }
      fprintf(__stream,"Cannot set current dir to: %s\n",ppQVar8);
      if ((QArrayData *)local_68.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_68.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_68.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_68.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68.a,1,0x10);
        }
      }
      if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
          (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
        LOCK();
        *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
        UNLOCK();
        if (*(int *)(QString **)local_88._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
LAB_00120bca:
      bVar6 = false;
    }
    else {
      local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
      local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
      local_68.b.m_size = (qsizetype)ppQStack_f0;
      local_88.alloc = 0;
      QVar12.m_size = (size_t)"%1/android_rcc_bundle.qrc";
      QVar12.field_0.m_data = local_170;
      local_88._0_8_ = &local_68;
      QtPrivate::argToQString(QVar12,0x4000000000000019,(ArgBase **)0x1);
      shellQuote(&local_e0,(QString *)local_170);
      local_78 = local_118.d.size | 0x8000000000000000;
      local_88.ref_._q_value.super___atomic_base<int>._M_i._0_1_ = 1;
      local_88.alloc = (qsizetype)local_118.d.ptr;
      local_98 = local_e0.d.size | 0x8000000000000000;
      local_a8 = (QStringBuilder<const_QString_&,_QLatin1String> *)CONCAT71(local_a8._1_7_,1);
      local_a0 = local_e0.d.ptr;
      local_68.b.m_size = (qsizetype)&local_a8;
      local_68.b.m_data = (char *)0x0;
      QVar13.m_size = (size_t)"%1 --project -o %2";
      QVar13.field_0.m_data = &local_c8;
      local_68.a = (QString *)&local_88;
      QtPrivate::argToQString(QVar13,0x4000000000000012,(ArgBase **)0x2);
      bVar6 = runCommand(options,(QString *)&local_c8);
      if (local_c8 != (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&local_c8->a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&local_c8->a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&local_c8->a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8,2,0x10);
        }
      }
      piVar1 = (int *)CONCAT71(local_e0.d.d._1_7_,local_e0.d.d._0_1_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT71(local_e0.d.d._1_7_,local_e0.d.d._0_1_),2,0x10);
        }
      }
      if (local_170[0] != (QArrayData *)0x0) {
        LOCK();
        (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_170[0],2,0x10);
        }
      }
      if (!bVar6) goto LAB_00120bca;
      bVar6 = options->isZstdCompressionEnabled;
      pcVar7 = "--no-zstd";
      if (bVar6 != false) {
        pcVar7 = (char *)0x0;
      }
      local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
      local_68.a._0_1_ = 1;
      local_68.b.m_size = (qsizetype)ppQStack_f0;
      local_a0 = (char16_t *)0x0;
      QVar14.m_size = (size_t)"%1/android_rcc_bundle.qrc";
      QVar14.field_0.m_data_utf8 = (char *)&local_88;
      local_a8 = &local_68;
      QtPrivate::argToQString(QVar14,0x4000000000000019,(ArgBase **)0x1);
      local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
      local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
      local_68.b.m_size = (qsizetype)ppQStack_f0;
      local_c0 = (char *)0x0;
      QVar15.m_size = (size_t)"%1/android_rcc_bundle/android_rcc_bundle.qrc";
      QVar15.field_0.m_data_utf8 = (char *)&local_a8;
      local_c8 = &local_68;
      QtPrivate::argToQString(QVar15,0x400000000000002c,(ArgBase **)0x1);
      QFile::rename((QString *)&local_88,(QString *)&local_a8);
      pQVar3 = local_a8;
      if (local_a8 != (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
        LOCK();
        *(int *)&local_a8->a = *(int *)&local_a8->a + -1;
        UNLOCK();
        if (*(int *)&pQVar3->a == 0) {
          QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
        }
      }
      if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
          (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
        LOCK();
        *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
        UNLOCK();
        if (*(int *)(QString **)local_88._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      QVar16.m_data = (storage_type_conflict *)0x1b;
      QVar16.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar16);
      local_1a8.d.d = (Data *)local_68.a;
      local_1a8.d.ptr = (char16_t *)local_68.b.m_size;
      local_1a8.d.size = (qsizetype)local_68.b.m_data;
      shellQuote(&local_188,&local_1a8);
      local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
      local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
      local_68.b.m_size = (qsizetype)ppQStack_f0;
      local_88.alloc = 0;
      QVar17.m_size = (size_t)"%1/android_rcc_bundle.rcc";
      QVar17.field_0.m_data = local_1d8;
      local_88._0_8_ = &local_68;
      QtPrivate::argToQString(QVar17,0x4000000000000019,(ArgBase **)0x1);
      shellQuote(&local_1c0,(QString *)local_1d8);
      local_78 = local_118.d.size | 0x8000000000000000;
      local_88.ref_._q_value.super___atomic_base<int>._M_i._0_1_ = 1;
      local_88.alloc = (qsizetype)local_118.d.ptr;
      local_98 = local_188.d.size | 0x8000000000000000;
      local_a8 = (QStringBuilder<const_QString_&,_QLatin1String> *)CONCAT71(local_a8._1_7_,1);
      local_a0 = local_188.d.ptr;
      local_b8 = (ulong)(bVar6 ^ 1) * 9 + 0x4000000000000000;
      local_c8 = (QStringBuilder<const_QString_&,_QLatin1String> *)CONCAT71(local_c8._1_7_,1);
      local_e0.d.size = local_1c0.d.size | 0x8000000000000000;
      local_e0.d.d._0_1_ = 1;
      local_e0.d.ptr = local_1c0.d.ptr;
      local_68.b.m_size = (qsizetype)&local_a8;
      local_68.b.m_data = (char *)&local_c8;
      local_50 = &local_e0;
      local_48 = 0;
      QVar18.m_size = (size_t)"%1 %2 %3 --binary -o %4 android_rcc_bundle.qrc";
      QVar18.field_0.m_data = local_170;
      local_c0 = pcVar7;
      local_68.a = (QString *)&local_88;
      QtPrivate::argToQString(QVar18,0x400000000000002e,(ArgBase **)&DAT_00000004);
      bVar6 = runCommand(options,(QString *)local_170);
      if (local_170[0] != (QArrayData *)0x0) {
        LOCK();
        (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_170[0],2,0x10);
        }
      }
      if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_1d8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_1d8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_1d8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_1d8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_1d8[0],2,0x10);
        }
      }
      if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      cVar5 = QDir::setCurrent((QString *)&local_158);
      if (cVar5 == '\0') {
        createRcc();
        goto LAB_00120bca;
      }
      if (options->noRccBundleCleanup == false) {
        local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
        local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
        local_68.b.m_size = (qsizetype)ppQStack_f0;
        local_a0 = (char16_t *)0x0;
        QVar19.m_size = (size_t)"%1/android_rcc_bundle.qrc";
        QVar19.field_0.m_data_utf8 = (char *)&local_88;
        local_a8 = &local_68;
        QtPrivate::argToQString(QVar19,0x4000000000000019,(ArgBase **)0x1);
        QFile::remove((QString *)&local_88);
        if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
            (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
          LOCK();
          *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)(QString **)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        local_68.b.m_data = (char *)((ulong)local_e8 | 0x8000000000000000);
        local_68.a = (QString *)CONCAT71(local_68.a._1_7_,1);
        local_68.b.m_size = (qsizetype)ppQStack_f0;
        local_a0 = (char16_t *)0x0;
        QVar20.m_size = (size_t)"%1/android_rcc_bundle";
        QVar20.field_0.m_data_utf8 = (char *)&local_88;
        local_a8 = &local_68;
        QtPrivate::argToQString(QVar20,0x4000000000000015,(ArgBase **)0x1);
        QDir::QDir((QDir *)&local_68,(QString *)&local_88);
        QDir::removeRecursively();
        QDir::~QDir((QDir *)&local_68);
        if ((QStringBuilder<const_QString_&,_QLatin1String> *)local_88._0_8_ !=
            (QStringBuilder<const_QString_&,_QLatin1String> *)0x0) {
          LOCK();
          *(int *)(QString **)local_88._0_8_ = *(int *)(QString **)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)(QString **)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
    }
    if (local_158 != (QArrayData *)0x0) {
      LOCK();
      (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_158,2,0x10);
      }
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00120c1e:
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool createRcc(const Options &options)
{
    auto assetsDir = "%1/assets"_L1.arg(options.outputDirectory);
    if (!QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.exists()) {
        fprintf(stdout, "Skipping createRCC\n");
        return true;
    }

    if (options.verbose)
        fprintf(stdout, "Create rcc bundle.\n");


    QString rcc;
    if (!options.rccBinaryPath.isEmpty()) {
        rcc = options.rccBinaryPath;
    } else {
        rcc = execSuffixAppended(options.qtLibExecsDirectory + "/rcc"_L1);
    }

    if (!QFile::exists(rcc)) {
        fprintf(stderr, "rcc not found: %s\n", qPrintable(rcc));
        return false;
    }
    auto currentDir = QDir::currentPath();
    if (!QDir::setCurrent("%1/android_rcc_bundle"_L1.arg(assetsDir))) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable("%1/android_rcc_bundle"_L1.arg(assetsDir)));
        return false;
    }

    bool res = runCommand(options, "%1 --project -o %2"_L1.arg(rcc, shellQuote("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir))));
    if (!res)
        return false;

    QLatin1StringView noZstd;
    if (!options.isZstdCompressionEnabled)
        noZstd = "--no-zstd"_L1;

    QFile::rename("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir), "%1/android_rcc_bundle/android_rcc_bundle.qrc"_L1.arg(assetsDir));

    res = runCommand(options, "%1 %2 %3 --binary -o %4 android_rcc_bundle.qrc"_L1.arg(rcc, shellQuote("--root=/android_rcc_bundle/"_L1),
                                                                                      noZstd,
                                                                                      shellQuote("%1/android_rcc_bundle.rcc"_L1.arg(assetsDir))));
    if (!QDir::setCurrent(currentDir)) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable(currentDir));
        return false;
    }
    if (!options.noRccBundleCleanup) {
        QFile::remove("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir));
        QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.removeRecursively();
    }
    return res;
}